

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-coloring.cpp
# Opt level: O2

void msdfgen::edgeColoringSimple(Shape *shape,double angleThreshold,unsigned_long_long seed)

{
  pointer pEVar1;
  int iVar2;
  pointer piVar3;
  EdgeSegment *pEVar4;
  ulong uVar5;
  EdgeSegment **ppEVar6;
  EdgeColor EVar7;
  EdgeHolder *pEVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  pointer this;
  pointer pEVar13;
  int m;
  ulong uVar14;
  int iVar15;
  int iVar16;
  EdgeHolder *pEVar17;
  EdgeSegment *extraout_XMM0_Qa;
  double dVar18;
  EdgeSegment *extraout_XMM0_Qa_00;
  EdgeSegment *in_XMM1_Qa;
  EdgeColor colors [3];
  undefined4 uStack_f4;
  int index;
  double local_e0;
  EdgeSegment *parts [7];
  unsigned_long_long seed_local;
  uint local_90;
  EdgeColor local_8c;
  vector<int,_std::allocator<int>_> corners;
  Vector2 local_58;
  double local_48;
  Vector2 local_40;
  
  seed_local = seed;
  local_48 = sin(angleThreshold);
  corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (shape->contours).super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
         _M_impl.super__Vector_impl_data._M_start;
  do {
    if (this == (shape->contours).
                super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                super__Vector_impl_data._M_finish) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&corners.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    if (corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    pEVar17 = (this->edges).
              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
              super__Vector_impl_data._M_start;
    pEVar8 = (this->edges).
             super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pEVar17 == pEVar8) {
LAB_001626e3:
      for (pEVar8 = (this->edges).
                    super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                    _M_impl.super__Vector_impl_data._M_start; pEVar8 != pEVar17; pEVar8 = pEVar8 + 1
          ) {
        pEVar4 = EdgeHolder::operator->(pEVar8);
        pEVar4->color = WHITE;
        pEVar17 = (this->edges).
                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      pEVar4 = EdgeHolder::operator->(pEVar8 + -1);
      (*pEVar4->_vptr_EdgeSegment[4])(0x3ff0000000000000,pEVar4);
      index = 0;
      pEVar13 = (this->edges).
                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar9 = -(long)pEVar13;
      parts[0] = extraout_XMM0_Qa;
      for (pEVar17 = pEVar13;
          piVar3 = corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start, parts[1] = in_XMM1_Qa,
          pEVar17 !=
          (this->edges).
          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
          super__Vector_impl_data._M_finish; pEVar17 = pEVar17 + 1) {
        _colors = Vector2::normalize((Vector2 *)parts,false);
        dVar18 = colors._8_8_;
        pEVar4 = EdgeHolder::operator->(pEVar17);
        (*pEVar4->_vptr_EdgeSegment[4])(0,pEVar4);
        local_40.y = dVar18;
        local_58 = Vector2::normalize(&local_40,false);
        dVar18 = dotProduct((Vector2 *)colors,&local_58);
        in_XMM1_Qa = (EdgeSegment *)0x0;
        if ((dVar18 <= 0.0) ||
           (dVar18 = crossProduct((Vector2 *)colors,&local_58), local_48 < ABS(dVar18))) {
          std::vector<int,_std::allocator<int>_>::push_back(&corners,&index);
        }
        pEVar4 = EdgeHolder::operator->(pEVar17);
        (*pEVar4->_vptr_EdgeSegment[4])(0x3ff0000000000000,pEVar4);
        index = index + 1;
        lVar9 = lVar9 + -8;
        pEVar13 = pEVar13 + 1;
        parts[0] = extraout_XMM0_Qa_00;
      }
      if (corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) goto LAB_001626e3;
      uVar5 = (long)corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar5 == 4) {
        colors = (EdgeColor  [3])ZEXT812(0x700000007);
        switchColor(colors,&seed_local,BLACK);
        EVar7 = colors[0];
        colors[2] = EVar7;
        switchColor(colors + 2,&seed_local,BLACK);
        iVar16 = *piVar3;
        pEVar8 = (this->edges).
                 super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar17 = (this->edges).
                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar5 = (long)pEVar17 - (long)pEVar8 >> 3;
        if (uVar5 < 3) {
          if (pEVar17 != pEVar8) {
            parts[4] = (EdgeSegment *)0x0;
            parts[5] = (EdgeSegment *)0x0;
            parts[2] = (EdgeSegment *)0x0;
            parts[3] = (EdgeSegment *)0x0;
            parts[0] = (EdgeSegment *)0x0;
            parts[1] = (EdgeSegment *)0x0;
            parts[6] = (EdgeSegment *)0x0;
            pEVar4 = EdgeHolder::operator->(pEVar8);
            (*pEVar4->_vptr_EdgeSegment[10])
                      (pEVar4,parts + (long)iVar16 * 3,parts + (long)(iVar16 * 3) + 1,
                       parts + (long)(iVar16 * 3) + 2);
            pEVar13 = (this->edges).
                      super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->edges).
                              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar13) < 9) {
              parts[0]->color = colors[0];
              parts[1]->color = colors[1];
              ppEVar6 = parts + 2;
            }
            else {
              pEVar4 = EdgeHolder::operator->(pEVar13 + 1);
              (*pEVar4->_vptr_EdgeSegment[10])
                        (pEVar4,parts + (iVar16 * -3 + 3),parts + (iVar16 * -3 + 4),
                         parts + (iVar16 * -3 + 5));
              parts[1]->color = colors[0];
              parts[0]->color = colors[0];
              parts[3]->color = colors[1];
              parts[2]->color = colors[1];
              parts[5]->color = colors[2];
              ppEVar6 = parts + 4;
            }
            (*ppEVar6)->color = colors[2];
            std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::clear
                      (&this->edges);
            for (ppEVar6 = parts; *ppEVar6 != (EdgeSegment *)0x0; ppEVar6 = ppEVar6 + 1) {
              EdgeHolder::EdgeHolder((EdgeHolder *)&local_58,*ppEVar6);
              std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
              emplace_back<msdfgen::EdgeHolder>(&this->edges,(EdgeHolder *)&local_58);
              EdgeHolder::~EdgeHolder((EdgeHolder *)&local_58);
            }
          }
        }
        else {
          iVar2 = (int)uVar5;
          local_e0 = (double)(iVar2 + -1);
          uVar10 = 0;
          iVar15 = 0;
          if (0 < iVar2) {
            uVar10 = uVar5 & 0xffffffff;
            iVar15 = 0;
          }
          for (; (int)uVar10 != iVar15; iVar15 = iVar15 + 1) {
            EVar7 = colors[(long)(int)(((double)iVar15 * 2.875) / local_e0 + 3.0 + -1.4375 + 0.5) +
                           -2];
            pEVar4 = EdgeHolder::operator->
                               ((this->edges).
                                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                                (iVar16 + iVar15) % iVar2);
            pEVar4->color = EVar7;
          }
        }
      }
      else {
        iVar16 = *corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar1 = (this->edges).
                 super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        parts[0] = (EdgeSegment *)CONCAT44(parts[0]._4_4_,7);
        uVar14 = 0;
        switchColor((EdgeColor *)parts,&seed_local,BLACK);
        iVar2 = (int)(uVar5 >> 2);
        local_90 = iVar2 - 2;
        uVar10 = (ulong)((long)pEVar13 - (long)pEVar1) >> 3;
        uVar5 = uVar10 & 0xffffffff;
        if ((int)uVar10 < 1) {
          uVar5 = uVar14;
        }
        local_8c = (EdgeColor)parts[0];
        local_e0 = (double)CONCAT44(local_e0._4_4_,(EdgeColor)parts[0]);
        while (iVar15 = (int)uVar5, uVar5 = (ulong)(iVar15 - 1), iVar15 != 0) {
          iVar15 = iVar16 % (int)((ulong)-((long)&pEVar1->edgeSegment + lVar9) >> 3);
          uVar12 = (uint)uVar14;
          uVar11 = uVar12 + 1;
          if (((int)uVar11 < iVar2) &&
             (corners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[(int)uVar11] == iVar15)) {
            EVar7 = BLACK;
            if (uVar12 == local_90) {
              EVar7 = local_8c;
            }
            switchColor((EdgeColor *)parts,&seed_local,EVar7);
            local_e0 = (double)CONCAT44(local_e0._4_4_,(EdgeColor)parts[0]);
            uVar12 = uVar11;
          }
          pEVar4 = EdgeHolder::operator->
                             ((this->edges).
                              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar15);
          pEVar4->color = local_e0._0_4_;
          iVar16 = iVar16 + 1;
          uVar14 = (ulong)uVar12;
        }
      }
    }
    this = this + 1;
  } while( true );
}

Assistant:

void edgeColoringSimple(Shape &shape, double angleThreshold, unsigned long long seed) {
    double crossThreshold = sin(angleThreshold);
    std::vector<int> corners;
    for (std::vector<Contour>::iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour) {
        // Identify corners
        corners.clear();
        if (!contour->edges.empty()) {
            Vector2 prevDirection = (*(contour->edges.end()-1))->direction(1);
            int index = 0;
            for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge, ++index) {
                if (isCorner(prevDirection.normalize(), (*edge)->direction(0).normalize(), crossThreshold))
                    corners.push_back(index);
                prevDirection = (*edge)->direction(1);
            }
        }

        // Smooth contour
        if (corners.empty())
            for (std::vector<EdgeHolder>::iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge)
                (*edge)->color = WHITE;
        // "Teardrop" case
        else if (corners.size() == 1) {
            EdgeColor colors[3] = { WHITE, WHITE };
            switchColor(colors[0], seed);
            switchColor(colors[2] = colors[0], seed);
            int corner = corners[0];
            if (contour->edges.size() >= 3) {
                int m = contour->edges.size();
                for (int i = 0; i < m; ++i)
                    contour->edges[(corner+i)%m]->color = (colors+1)[int(3+2.875*i/(m-1)-1.4375+.5)-3];
            } else if (contour->edges.size() >= 1) {
                // Less than three edge segments for three colors => edges must be split
                EdgeSegment *parts[7] = { };
                contour->edges[0]->splitInThirds(parts[0+3*corner], parts[1+3*corner], parts[2+3*corner]);
                if (contour->edges.size() >= 2) {
                    contour->edges[1]->splitInThirds(parts[3-3*corner], parts[4-3*corner], parts[5-3*corner]);
                    parts[0]->color = parts[1]->color = colors[0];
                    parts[2]->color = parts[3]->color = colors[1];
                    parts[4]->color = parts[5]->color = colors[2];
                } else {
                    parts[0]->color = colors[0];
                    parts[1]->color = colors[1];
                    parts[2]->color = colors[2];
                }
                contour->edges.clear();
                for (int i = 0; parts[i]; ++i)
                    contour->edges.push_back(EdgeHolder(parts[i]));
            }
        }
        // Multiple corners
        else {
            int cornerCount = corners.size();
            int spline = 0;
            int start = corners[0];
            int m = contour->edges.size();
            EdgeColor color = WHITE;
            switchColor(color, seed);
            EdgeColor initialColor = color;
            for (int i = 0; i < m; ++i) {
                int index = (start+i)%m;
                if (spline+1 < cornerCount && corners[spline+1] == index) {
                    ++spline;
                    switchColor(color, seed, EdgeColor((spline == cornerCount-1)*initialColor));
                }
                contour->edges[index]->color = color;
            }
        }
    }
}